

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O3

void __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::GetGenerators
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30.field_2._M_allocated_capacity._0_6_ = 0x4d2078696e55;
  local_30.field_2._M_allocated_capacity._6_2_ = 0x6b61;
  local_30.field_2._8_6_ = 0x73656c696665;
  local_30._M_string_length = 0xe;
  local_30.field_2._M_local_buf[0xe] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT26(local_30.field_2._M_allocated_capacity._6_2_,
                             local_30.field_2._M_allocated_capacity._0_6_) + 1);
  }
  return;
}

Assistant:

virtual void GetGenerators(std::vector<std::string>& names) const {
    names.push_back(T::GetActualName()); }